

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::Texture3DMipmapCase::iterate(Texture3DMipmapCase *this)

{
  CoordType CVar1;
  Texture3D *pTVar2;
  RenderContext *context;
  TestLog *pTVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [8];
  int iVar7;
  int iVar8;
  deUint32 dVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RenderTarget *pRVar10;
  long lVar11;
  size_t __n;
  Surface *pSVar12;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  char *description;
  int iVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  PixelFormat *format;
  allocator<char> local_4db;
  allocator<char> local_4da;
  allocator<char> local_4d9;
  int local_4d8;
  int local_4d4;
  ulong local_4d0;
  long local_4c8;
  CoordType local_4bc;
  ulong local_4b8;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  LodPrecision lodPrec;
  Texture3DView local_450;
  ConstPixelBufferAccess local_440;
  PixelBufferAccess local_418;
  long local_3f0;
  Texture3D *local_3e8;
  PixelBufferAccess local_3e0;
  Surface referenceFrame;
  Surface renderedFrame;
  PixelBufferAccess local_388;
  Surface errorMask;
  undefined1 local_348 [32];
  _func_int **pp_Stack_328;
  BVec4 local_320;
  undefined1 local_314 [76];
  _func_int **pp_Stack_2c8;
  size_type local_2c0;
  int aiStack_2b8 [2];
  int local_2b0;
  anon_union_16_3_1194ccdc_for_v local_2ac [2];
  LogImage local_280;
  undefined1 local_1f0 [8];
  _func_int **pp_Stack_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  int local_1d0;
  anon_union_16_3_1194ccdc_for_v local_1cc [21];
  TextureFormatInfo fmtInfo;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_4b8 = CONCAT44(extraout_var,iVar7);
  pTVar2 = this->m_texture;
  tcu::getTextureFormatInfo(&fmtInfo,(TextureFormat *)&pTVar2->m_refTexture);
  iVar7 = (pTVar2->m_refTexture).m_width;
  iVar13 = (pTVar2->m_refTexture).m_height;
  local_3e8 = pTVar2;
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  dVar9 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar8),iVar7 << 2,iVar13 << 2,dVar9)
  ;
  CVar1 = this->m_coordType;
  local_4d4 = viewport.width / 4;
  local_4d8 = viewport.height / 4;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_314,TEXTURETYPE_3D);
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::mapGLSampler((Sampler *)local_1f0,this->m_wrapS,this->m_wrapT,this->m_wrapR,this->m_minFilter
                    ,0x2600);
  local_2b0 = local_1d0;
  local_2c0 = local_1e0._M_allocated_capacity;
  aiStack_2b8[0] = local_1e0._8_4_;
  aiStack_2b8[1] = local_1e0._12_4_;
  local_314._68_8_ = local_1f0;
  pp_Stack_2c8 = pp_Stack_1e8;
  local_2ac[0]._0_8_ = local_1cc[0]._0_8_;
  local_2ac[0]._8_8_ = local_1cc[0]._8_8_;
  local_2ac[1]._0_8_ = local_1cc[1]._0_8_;
  local_314._4_4_ =
       glu::TextureTestUtil::getSamplerType
                 ((pTVar2->m_refTexture).super_TextureLevelPyramid.m_format);
  uVar16 = local_4b8;
  local_314._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_314._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_314._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_314._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_314._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_314._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_314._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_314._48_4_ = fmtInfo.lookupScale.m_data[3];
  local_314._8_4_ = (uint)(CVar1 == COORDTYPE_PROJECTED) + (uint)(CVar1 == COORDTYPE_BASIC_BIAS) * 2
  ;
  (**(code **)(local_4b8 + 0xb8))(0x806f,this->m_texture->m_glTexture);
  (**(code **)(uVar16 + 0x1360))(0x806f,0x2802,this->m_wrapS);
  (**(code **)(uVar16 + 0x1360))(0x806f,0x2803,this->m_wrapT);
  (**(code **)(uVar16 + 0x1360))(0x806f,0x8072,this->m_wrapR);
  (**(code **)(uVar16 + 0x1360))(0x806f,0x2801,this->m_minFilter);
  (**(code **)(uVar16 + 0x1360))(0x806f,0x2800,0x2600);
  dVar9 = (**(code **)(uVar16 + 0x800))();
  glu::checkError(dVar9,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x505);
  local_4bc = CVar1;
  if (iterate()::s_projections == '\0') {
    iVar7 = __cxa_guard_acquire(&iterate()::s_projections);
    if (iVar7 != 0) {
      iterate::s_projections[0].m_data[0] = _DAT_01801430;
      iterate::s_projections[0].m_data[1] = _UNK_01801434;
      iterate::s_projections[0].m_data[2] = _UNK_01801438;
      iterate::s_projections[0].m_data[3] = _UNK_0180143c;
      iterate::s_projections[1].m_data[0] = _DAT_01801440;
      iterate::s_projections[1].m_data[1] = _UNK_01801444;
      iterate::s_projections[1].m_data[2] = _UNK_01801448;
      iterate::s_projections[1].m_data[3] = _UNK_0180144c;
      iterate::s_projections[2].m_data[0] = _DAT_01801450;
      iterate::s_projections[2].m_data[1] = _UNK_01801454;
      iterate::s_projections[2].m_data[2] = _UNK_01801458;
      iterate::s_projections[2].m_data[3] = _UNK_0180145c;
      iterate::s_projections[3].m_data[0] = _DAT_01801460;
      iterate::s_projections[3].m_data[1] = _UNK_01801464;
      iterate::s_projections[3].m_data[2] = _UNK_01801468;
      iterate::s_projections[3].m_data[3] = _UNK_0180146c;
      __cxa_guard_release(&iterate()::s_projections);
    }
  }
  uVar16 = 0;
  lVar11 = 0;
  do {
    if (lVar11 == 4) {
      context = ((this->super_TestCase).m_context)->m_renderCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)local_1f0,&renderedFrame);
      glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1f0);
      pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
      uVar15 = this->m_minFilter;
      tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
      CVar1 = local_4bc;
      tcu::Surface::Surface(&errorMask,viewport.width,viewport.height);
      tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_348);
      format = &pRVar10->m_pixelFormat;
      lodPrec.rule = RULE_OPENGL;
      lodPrec.derivateBits = 0x16;
      lodPrec.lodBits = 0x10;
      local_348._0_4_ = 0x14;
      local_348._4_4_ = 0x14;
      local_348._8_4_ = 0x14;
      local_348._12_4_ = 0x10;
      local_348._16_4_ = 0x10;
      local_348._20_4_ = 0x10;
      local_418.super_ConstPixelBufferAccess.m_format.order = format->redBits;
      local_418.super_ConstPixelBufferAccess.m_format.type = format->greenBits;
      local_418.super_ConstPixelBufferAccess.m_size.m_data[0] = (pRVar10->m_pixelFormat).blueBits;
      local_418.super_ConstPixelBufferAccess.m_size.m_data[1] = (pRVar10->m_pixelFormat).alphaBits;
      tcu::operator-((tcu *)&local_440,(Vector<int,_4> *)&local_418,
                     ((uVar15 & 0xfffffffe) == 0x2702) + 1);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_3e0,0);
      tcu::max<int,4>((tcu *)&local_280,(Vector<int,_4> *)&local_440,(Vector<int,_4> *)&local_3e0);
      tcu::computeFixedPointThreshold((tcu *)local_1f0,(IVec4 *)&local_280);
      local_348._24_8_ = local_1f0;
      pp_Stack_328 = pp_Stack_1e8;
      glu::TextureTestUtil::getCompareMask(format);
      auVar6 = local_1f0;
      local_320.m_data[0] = (bool)local_1f0[0];
      local_320.m_data[1] = (bool)local_1f0[1];
      local_320.m_data[2] = (bool)local_1f0[2];
      local_320.m_data[3] = (bool)local_1f0[3];
      lodPrec.derivateBits = 10;
      lodPrec.lodBits = (uint)(CVar1 != COORDTYPE_PROJECTED) * 2 + 6;
      lVar11 = 0;
      __n = 0;
      local_4d0 = local_4d0 & 0xffffffff00000000;
      local_1f0 = auVar6;
      do {
        if (__n == 4) {
          if (0 < (int)local_4d0) {
            local_1f0 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e8);
            std::operator<<((ostream *)&pp_Stack_1e8,"ERROR: Image verification failed, found ");
            std::ostream::operator<<((ostringstream *)&pp_Stack_1e8,(int)local_4d0);
            std::operator<<((ostream *)&pp_Stack_1e8," invalid pixels!");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e8);
          }
          pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_440,"Result",(allocator<char> *)&local_450);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_418,"Verification result",&local_4d9);
          tcu::LogImageSet::LogImageSet
                    ((LogImageSet *)&local_280,(string *)&local_440,(string *)&local_418);
          iVar7 = (int)pTVar3;
          tcu::LogImageSet::write((LogImageSet *)&local_280,iVar7,__buf,__n);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3e0,"Rendered",&local_4da);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_388,"Rendered image",&local_4db);
          pSVar12 = &renderedFrame;
          tcu::LogImage::LogImage
                    ((LogImage *)local_1f0,(string *)&local_3e0,(string *)&local_388,pSVar12,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1f0,iVar7,__buf_00,(size_t)pSVar12);
          tcu::LogImage::~LogImage((LogImage *)local_1f0);
          std::__cxx11::string::~string((string *)&local_388);
          std::__cxx11::string::~string((string *)&local_3e0);
          tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_280);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&local_440);
          if (0 < (int)local_4d0) {
            pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_440,"Reference",(allocator<char> *)&local_450);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_418,"Ideal reference",&local_4d9);
            pSVar12 = &referenceFrame;
            tcu::LogImage::LogImage
                      ((LogImage *)local_1f0,(string *)&local_440,(string *)&local_418,pSVar12,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            iVar7 = (int)pTVar3;
            tcu::LogImage::write((LogImage *)local_1f0,iVar7,__buf_01,(size_t)pSVar12);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3e0,"ErrorMask",&local_4da);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_388,"Error mask",&local_4db);
            pSVar12 = &errorMask;
            tcu::LogImage::LogImage
                      (&local_280,(string *)&local_3e0,(string *)&local_388,pSVar12,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write(&local_280,iVar7,__buf_02,(size_t)pSVar12);
            tcu::LogImage::~LogImage(&local_280);
            std::__cxx11::string::~string((string *)&local_388);
            std::__cxx11::string::~string((string *)&local_3e0);
            tcu::LogImage::~LogImage((LogImage *)local_1f0);
            std::__cxx11::string::~string((string *)&local_418);
            std::__cxx11::string::~string((string *)&local_440);
          }
          tcu::TestLog::endImageSet
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
          description = "Pass";
          if ((int)local_4d0 != 0) {
            description = "Image verification failed";
          }
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     (uint)((int)local_4d0 != 0),description);
          tcu::Surface::~Surface(&errorMask);
          tcu::Surface::~Surface(&referenceFrame);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
          tcu::Surface::~Surface(&renderedFrame);
          return STOP;
        }
        iVar7 = local_4d8 * (int)__n;
        iVar13 = 0;
        local_4b8 = local_4b8 & 0xffffffff00000000;
        local_4c8 = lVar11;
        local_3f0 = lVar11;
        for (lVar14 = 0; lVar14 != 0x40; lVar14 = lVar14 + 0x10) {
          iVar8 = viewport.width + (int)local_4b8;
          if (lVar14 != 0x30) {
            iVar8 = local_4d4;
          }
          iVar4 = viewport.height - iVar7;
          if (__n != 3) {
            iVar4 = local_4d8;
          }
          CVar1 = this->m_coordType;
          if (CVar1 < COORDTYPE_AFFINE) {
LAB_01018200:
            getBasicTexCoord3D(&texCoord,(int)local_4c8);
          }
          else if (CVar1 == COORDTYPE_AFFINE) {
            getAffineTexCoord3D(&texCoord,(int)local_4c8);
          }
          else if (CVar1 == COORDTYPE_PROJECTED) goto LAB_01018200;
          if (local_4bc == COORDTYPE_PROJECTED) {
            local_314._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar14);
            local_314._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar14 + 8);
          }
          else if (local_4bc == COORDTYPE_BASIC_BIAS) {
            local_314._28_4_ =
                 deqp::gles2::Accuracy::Texture2DMipmapCase::iterate::s_bias[(uint)local_4c8 & 7];
          }
          tcu::SurfaceAccess::SurfaceAccess
                    ((SurfaceAccess *)local_1f0,&referenceFrame,format,iVar13,iVar7,iVar8,iVar4);
          local_280.m_name._M_dataplus._M_p._0_4_ = (local_3e8->m_refTexture).m_view.m_numLevels;
          local_280.m_name._M_string_length = (size_type)(local_3e8->m_refTexture).m_view.m_levels;
          glu::TextureTestUtil::sampleTexture
                    ((SurfaceAccess *)local_1f0,(Texture3DView *)&local_280,
                     texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,(ReferenceParams *)local_314);
          tcu::Surface::getAccess((PixelBufferAccess *)&local_280,&renderedFrame);
          tcu::getSubregion((PixelBufferAccess *)local_1f0,(PixelBufferAccess *)&local_280,iVar13,
                            iVar7,iVar8,iVar4);
          tcu::Surface::getAccess(&local_418,&referenceFrame);
          tcu::getSubregion((PixelBufferAccess *)&local_440,&local_418,iVar13,iVar7,iVar8,iVar4);
          tcu::Surface::getAccess(&local_388,&errorMask);
          tcu::getSubregion(&local_3e0,&local_388,iVar13,iVar7,iVar8,iVar4);
          local_450.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
          local_450.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
          iVar8 = glu::TextureTestUtil::computeTextureLookupDiff
                            ((ConstPixelBufferAccess *)local_1f0,&local_440,&local_3e0,&local_450,
                             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start,(ReferenceParams *)local_314,
                             (LookupPrecision *)local_348,&lodPrec,
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                             m_watchDog);
          local_4d0 = CONCAT44(local_4d0._4_4_,(int)local_4d0 + iVar8);
          local_4c8 = local_4c8 + 1;
          local_4b8 = CONCAT44(local_4b8._4_4_,(int)local_4b8 - local_4d4);
          iVar13 = iVar13 + local_4d4;
        }
        __n = __n + 1;
        lVar11 = local_3f0 + 4;
      } while( true );
    }
    iVar7 = local_4d8 * (int)lVar11;
    iVar13 = 0;
    iVar8 = 0;
    local_4d0 = uVar16;
    local_4c8 = lVar11;
    for (lVar14 = 0; lVar14 != 0x40; lVar14 = lVar14 + 0x10) {
      iVar4 = viewport.width + iVar8;
      if (lVar14 != 0x30) {
        iVar4 = local_4d4;
      }
      iVar5 = viewport.height - iVar7;
      if (local_4c8 != 3) {
        iVar5 = local_4d8;
      }
      CVar1 = this->m_coordType;
      uVar15 = (uint)uVar16;
      if (CVar1 < COORDTYPE_AFFINE) {
LAB_01017f0e:
        getBasicTexCoord3D(&texCoord,uVar15);
      }
      else if (CVar1 == COORDTYPE_AFFINE) {
        getAffineTexCoord3D(&texCoord,uVar15);
      }
      else if (CVar1 == COORDTYPE_PROJECTED) goto LAB_01017f0e;
      if (local_4bc == COORDTYPE_PROJECTED) {
        local_314._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar14);
        local_314._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar14 + 8);
      }
      else if (local_4bc == COORDTYPE_BASIC_BIAS) {
        local_314._28_4_ = deqp::gles2::Accuracy::Texture2DMipmapCase::iterate::s_bias[uVar15 & 7];
      }
      (**(code **)(local_4b8 + 0x1a00))(viewport.x + iVar13,viewport.y + iVar7,iVar4,iVar5);
      uVar16 = uVar16 + 1;
      iVar8 = iVar8 - local_4d4;
      iVar13 = iVar13 + local_4d4;
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(RenderParams *)local_314);
    }
    lVar11 = local_4c8 + 1;
    uVar16 = local_4d0 + 4;
  } while( true );
}

Assistant:

Texture3DMipmapCase::IterateResult Texture3DMipmapCase::iterate (void)
{
	const glw::Functions&			gl					= m_context.getRenderContext().getFunctions();

	const tcu::Texture3D&			refTexture			= m_texture->getRefTexture();
	const tcu::TextureFormat&		texFmt				= refTexture.getFormat();
	const tcu::TextureFormatInfo	fmtInfo				= tcu::getTextureFormatInfo(texFmt);
	const int						texWidth			= refTexture.getWidth();
	const int						texHeight			= refTexture.getHeight();
	const deUint32					magFilter			= GL_NEAREST;

	const tcu::RenderTarget&		renderTarget		= m_context.getRenderContext().getRenderTarget();
	const RandomViewport			viewport			(renderTarget, texWidth*4, texHeight*4, deStringHash(getName()));

	const bool						isProjected			= m_coordType == COORDTYPE_PROJECTED;
	const bool						useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	// Viewport is divided into 4x4 grid.
	const int						gridWidth			= 4;
	const int						gridHeight			= 4;
	const int						cellWidth			= viewport.width / gridWidth;
	const int						cellHeight			= viewport.height / gridHeight;

	ReferenceParams					sampleParams		(TEXTURETYPE_3D);

	tcu::Surface					renderedFrame		(viewport.width, viewport.height);
	vector<float>					texCoord;

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_wrapR, m_minFilter, magFilter);
	sampleParams.samplerType	= getSamplerType(texFmt);
	sampleParams.colorBias		= fmtInfo.lookupBias;
	sampleParams.colorScale		= fmtInfo.lookupScale;
	sampleParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);

	// Bind texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_3D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		m_wrapR);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int		curX		= cellWidth*gridX;
			const int		curY		= cellHeight*gridY;
			const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			const int		cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord3D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord3D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			// Set projection.
			if (isProjected)
				sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			// Set LOD bias.
			if (useLodBias)
				sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	// Read result.
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log
	{
		const tcu::PixelFormat&	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 20);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 16); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 6 : 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				switch (m_coordType)
				{
					case COORDTYPE_BASIC_BIAS:	// Fall-through.
					case COORDTYPE_PROJECTED:
					case COORDTYPE_BASIC:		getBasicTexCoord3D	(texCoord, cellNdx);	break;
					case COORDTYPE_AFFINE:		getAffineTexCoord3D	(texCoord, cellNdx);	break;
					default:					DE_ASSERT(DE_FALSE);
				}

				if (isProjected)
					sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

				if (useLodBias)
					sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}